

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O0

void __thiscall
TPZInterpolationSpace::MinMaxSolutionValues
          (TPZInterpolationSpace *this,TPZVec<double> *min,TPZVec<double> *max)

{
  int iVar1;
  long *plVar2;
  TPZIntPoints *pTVar3;
  int64_t iVar4;
  TPZManVector<double,_10> *pTVar5;
  double *pdVar6;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  long *in_RDI;
  int iv;
  TPZSolVec<STATE> *sol;
  int int_ind;
  int nvars;
  int intrulepoints;
  bool hasPhi;
  TPZMaterialDataT<double> data;
  REAL weight;
  TPZFNMatrix<9,_double> axes;
  TPZManVector<int,_3> maxorder;
  TPZManVector<int,_3> prevorder;
  TPZAutoPointer<TPZIntPoints> intrule;
  TPZManVector<double,_3> intpoint;
  int dim;
  undefined8 in_stack_ffffffffffff7ad8;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7ae0;
  TPZVec<double> *in_stack_ffffffffffff7ae8;
  TPZInterpolationSpace *in_stack_ffffffffffff7af0;
  TPZIntPoints *in_stack_ffffffffffff7af8;
  TPZAutoPointer<TPZIntPoints> *in_stack_ffffffffffff7b00;
  double dVar7;
  double *in_stack_ffffffffffff7b08;
  TPZMaterialDataT<double> *in_stack_ffffffffffff7b10;
  int64_t in_stack_ffffffffffff7b18;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffff7b20;
  int local_8424;
  uint local_8418;
  TPZVec<TPZManVector<double,_10>_> local_3b38 [459];
  undefined1 local_1d8 [8];
  undefined8 local_1d0;
  int local_e4;
  undefined1 local_e0 [52];
  undefined4 local_ac;
  undefined1 local_a8 [64];
  TPZAutoPointer<TPZIntPoints> local_68;
  undefined8 local_60;
  undefined1 local_58 [60];
  undefined4 local_1c;
  TPZVec<double> *local_18;
  TPZVec<double> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = (**(code **)(*in_RDI + 0xb0))();
  local_60 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffff7b10,(int64_t)in_stack_ffffffffffff7b08
             ,(double *)in_stack_ffffffffffff7b00);
  plVar2 = (long *)(**(code **)(*in_RDI + 0x2c8))();
  (**(code **)(*plVar2 + 0x48))();
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(in_stack_ffffffffffff7b00,in_stack_ffffffffffff7af8);
  local_ac = 0;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_ffffffffffff7b10,(int64_t)in_stack_ffffffffffff7b08,
             (int *)in_stack_ffffffffffff7b00);
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  (*pTVar3->_vptr_TPZIntPoints[6])(pTVar3,local_a8);
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  local_e4 = (*pTVar3->_vptr_TPZIntPoints[7])();
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_ffffffffffff7b10,(int64_t)in_stack_ffffffffffff7b08,
             (int *)in_stack_ffffffffffff7b00);
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  (*pTVar3->_vptr_TPZIntPoints[5])(pTVar3,local_e0,0);
  local_1d0 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffff7b20,in_stack_ffffffffffff7b18,(int64_t)in_stack_ffffffffffff7b10,
             in_stack_ffffffffffff7b08);
  TPZMaterialDataT<double>::TPZMaterialDataT(in_stack_ffffffffffff7b10);
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  iVar1 = (*pTVar3->_vptr_TPZIntPoints[3])();
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  (*pTVar3->_vptr_TPZIntPoints[4])(pTVar3,0,local_58,local_1d8);
  ComputeSolution(in_stack_ffffffffffff7af0,in_stack_ffffffffffff7ae8,in_stack_ffffffffffff7ae0,
                  SUB81((ulong)in_stack_ffffffffffff7ad8 >> 0x38,0));
  TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
  TPZVec<double>::operator=((TPZVec<double> *)in_stack_ffffffffffff7af0,in_stack_ffffffffffff7ae8);
  TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
  TPZVec<double>::operator=((TPZVec<double> *)in_stack_ffffffffffff7af0,in_stack_ffffffffffff7ae8);
  iVar4 = TPZVec<TPZManVector<double,_10>_>::NElements(local_3b38);
  for (local_8418 = 1; (int)local_8418 < iVar1; local_8418 = local_8418 + 1) {
    pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
    (*pTVar3->_vptr_TPZIntPoints[4])(pTVar3,(ulong)local_8418,local_58,local_1d8);
    ComputeSolution(in_stack_ffffffffffff7af0,in_stack_ffffffffffff7ae8,in_stack_ffffffffffff7ae0,
                    SUB81((ulong)in_stack_ffffffffffff7ad8 >> 0x38,0));
    for (local_8424 = 0; local_8424 < (int)iVar4; local_8424 = local_8424 + 1) {
      pTVar5 = TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
      pdVar6 = TPZVec<double>::operator[](&pTVar5->super_TPZVec<double>,(long)local_8424);
      dVar7 = *pdVar6;
      pdVar6 = TPZVec<double>::operator[](local_10,(long)local_8424);
      if (dVar7 < *pdVar6) {
        pTVar5 = TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
        pdVar6 = TPZVec<double>::operator[](&pTVar5->super_TPZVec<double>,(long)local_8424);
        dVar7 = *pdVar6;
        pdVar6 = TPZVec<double>::operator[](local_10,(long)local_8424);
        *pdVar6 = dVar7;
      }
      pTVar5 = TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
      pdVar6 = TPZVec<double>::operator[](&pTVar5->super_TPZVec<double>,(long)local_8424);
      dVar7 = *pdVar6;
      pdVar6 = TPZVec<double>::operator[](local_18,(long)local_8424);
      if (*pdVar6 <= dVar7 && dVar7 != *pdVar6) {
        pTVar5 = TPZVec<TPZManVector<double,_10>_>::operator[](local_3b38,0);
        in_stack_ffffffffffff7af0 =
             (TPZInterpolationSpace *)
             TPZVec<double>::operator[](&pTVar5->super_TPZVec<double>,(long)local_8424);
        in_stack_ffffffffffff7ae0 =
             *(TPZMaterialDataT<double> **)&in_stack_ffffffffffff7af0->super_TPZCompEl;
        in_stack_ffffffffffff7ae8 =
             (TPZVec<double> *)TPZVec<double>::operator[](local_18,(long)local_8424);
        in_stack_ffffffffffff7ae8->_vptr_TPZVec = (_func_int **)in_stack_ffffffffffff7ae0;
      }
    }
  }
  pTVar3 = TPZAutoPointer<TPZIntPoints>::operator->(&local_68);
  (*pTVar3->_vptr_TPZIntPoints[5])(pTVar3,local_a8,0);
  TPZMaterialDataT<double>::~TPZMaterialDataT(in_stack_ffffffffffff7ae0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1b19b93);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_ffffffffffff7ae0);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_ffffffffffff7ae0);
  TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer
            ((TPZAutoPointer<TPZIntPoints> *)in_stack_ffffffffffff7ae0);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_ffffffffffff7ae0);
  return;
}

Assistant:

void TPZInterpolationSpace::MinMaxSolutionValues(TPZVec<STATE> &min, TPZVec<STATE> &max){
	
	const int dim = Dimension();
	TPZManVector<REAL,3> intpoint(dim,0.);
	
	TPZAutoPointer<TPZIntPoints> intrule = GetIntegrationRule().Clone();
	TPZManVector<int,3> prevorder(dim,0);
	intrule->GetOrder(prevorder);
	
	TPZManVector<int,3> maxorder(dim,intrule->GetMaxOrder());
	intrule->SetOrder(maxorder);
	
	
	TPZFNMatrix<9> axes(3,3,0.);
	REAL weight;
	TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
	const int intrulepoints = intrule->NPoints();
	intrule->Point(0,intpoint,weight);
    
	this->ComputeSolution(intpoint, data,hasPhi);
	min = data.sol[0];
	max = data.sol[0];
	const int nvars = data.sol.NElements();
	for(int int_ind = 1; int_ind < intrulepoints; int_ind++){
		intrule->Point(int_ind,intpoint,weight);
		this->ComputeSolution(intpoint, data,hasPhi);
        TPZSolVec<STATE> &sol = data.sol;
		for(int iv = 0; iv < nvars; iv++){
			if (sol[0][iv] < min[iv]) min[iv] = sol[0][iv];
			if (sol[0][iv] > max[iv]) max[iv] = sol[0][iv];
		}//iv
	}//loop over integratin points
	
	intrule->SetOrder(prevorder);
	
}